

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

void Am_Register_For_Undo
               (Am_Object *inter,Am_Object *command_obj,Am_Object *object_modified,
               Am_Inter_Location *data,Am_Impl_Command_Setter *impl_command_setter)

{
  Am_Register_Command_Method_Type *pAVar1;
  bool bVar2;
  Am_Value *value;
  Am_Wrapper *pAVar3;
  Am_Object impl_command;
  Am_Object undo_handler;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Inter_Location local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Register_Command_Method method;
  
  Am_Inter_Find_Undo_Handler(&undo_handler);
  method.from_wrapper = (Am_Method_Wrapper *)0x0;
  method.Call = (Am_Register_Command_Method_Type *)0x0;
  bVar2 = Am_Object::Valid(&undo_handler);
  if (bVar2) {
    value = Am_Object::Get(&undo_handler,0x175,0);
    Am_Register_Command_Method::operator=(&method,value);
    if ((impl_command_setter != (Am_Impl_Command_Setter *)0x0) &&
       (method.Call != (Am_Register_Command_Method_Type *)0x0)) {
      Am_Object::Am_Object(&local_50,inter);
      Am_Object::Am_Object(&local_58,object_modified);
      Am_Inter_Location::Am_Inter_Location(&local_60,data);
      (*impl_command_setter)
                ((Am_Object_Data *)&impl_command,(Am_Object_Data *)&local_50,
                 (Am_Inter_Location_Data *)&local_58);
      Am_Inter_Location::~Am_Inter_Location(&local_60);
      Am_Object::~Am_Object(&local_58);
      Am_Object::~Am_Object(&local_50);
      bVar2 = Am_Object::Valid(&impl_command);
      if (bVar2) {
        bVar2 = Am_Object::Valid(command_obj);
        if (bVar2) {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(command_obj);
          Am_Object::Set(&impl_command,0x154,pAVar3,0);
        }
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(inter);
        Am_Object::Set(&impl_command,0x170,pAVar3,1);
        pAVar1 = method.Call;
        Am_Object::Am_Object(&local_68,&undo_handler);
        Am_Object::Am_Object(&local_70,&impl_command);
        (*pAVar1)((Am_Object_Data *)&local_68,(Am_Object_Data *)&local_70);
        Am_Object::~Am_Object(&local_70);
        Am_Object::~Am_Object(&local_68);
      }
      bVar2 = Am_Object::Valid(command_obj);
      pAVar1 = method.Call;
      if (bVar2) {
        Am_Object::Am_Object(&local_78,&undo_handler);
        Am_Object::Am_Object(&local_80,command_obj);
        (*pAVar1)((Am_Object_Data *)&local_78,(Am_Object_Data *)&local_80);
        Am_Object::~Am_Object(&local_80);
        Am_Object::~Am_Object(&local_78);
      }
      Am_Object::~Am_Object(&impl_command);
    }
  }
  bVar2 = Am_Object::Valid(command_obj);
  if (bVar2) {
    Am_Process_All_Parent_Commands(command_obj,&undo_handler,&method);
  }
  Am_Object::~Am_Object(&undo_handler);
  return;
}

Assistant:

void
Am_Register_For_Undo(Am_Object inter, Am_Object command_obj,
                     Am_Object object_modified, Am_Inter_Location data,
                     Am_Impl_Command_Setter *impl_command_setter)
{
  Am_Object undo_handler = Am_Inter_Find_Undo_Handler(inter);
  Am_Register_Command_Method method;
  if (undo_handler.Valid()) {
    method = undo_handler.Get(Am_REGISTER_COMMAND);
    if (method.Valid() && impl_command_setter) {
      Am_Object impl_command =
          impl_command_setter(inter, object_modified, data);
      if (impl_command.Valid()) {
        if (command_obj.Valid())
          impl_command.Set(Am_IMPLEMENTATION_PARENT, command_obj);
        impl_command.Set(Am_SAVED_OLD_OWNER, inter, Am_OK_IF_NOT_THERE);
        method.Call(undo_handler, impl_command);
      }
      if (command_obj.Valid())
        method.Call(undo_handler, command_obj);
    }
  }
  if (command_obj.Valid()) {
    Am_Process_All_Parent_Commands(command_obj, undo_handler, method);
  }
}